

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O3

void __thiscall
reader_authority_suite::test_ipv6_line_9a_v6::test_method(test_ipv6_line_9a_v6 *this)

{
  char *local_148;
  view_type *local_140;
  undefined1 local_138 [8];
  undefined8 local_130;
  shared_count sStack_128;
  char local_120 [4];
  view_type local_11c;
  undefined8 *local_108;
  char *local_100;
  undefined **local_f8;
  undefined1 local_f0;
  undefined8 *local_e8;
  undefined1 *local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined8 *local_c8;
  view_type **local_c0;
  char *local_b8;
  char *local_b0;
  char input [9];
  basic_authority<char> local_98;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  builtin_strncpy(input,"[1111::]",9);
  local_98.super_base<char,_trial::url::reader::basic_authority>.input.len_ = strlen(input);
  local_98.super_base<char,_trial::url::reader::basic_authority>.current_token = end;
  local_98.super_base<char,_trial::url::reader::basic_authority>.input.ptr_ = input;
  local_98.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_ = input;
  local_98.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ =
       local_98.super_base<char,_trial::url::reader::basic_authority>.input.len_;
  trial::url::reader::basic_authority<char>::do_next(&local_98);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1d9);
  local_11c.len_._4_1_ = 0;
  local_11c._4_8_ = &PTR__lazy_ostream_00186288;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_140 = &local_11c;
  local_11c.ptr_._0_4_ =
       local_98.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_148 = local_120;
  local_120[0] = '\x06';
  local_120[1] = '\0';
  local_120[2] = '\0';
  local_120[3] = '\0';
  local_138[0] = local_98.super_base<char,_trial::url::reader::basic_authority>.current_token ==
                 authority_host_ipv6;
  local_130 = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b0 = "";
  local_c0 = &local_140;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_00186618;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_00186618;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = (undefined1 *)&local_148;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x1da);
  local_11c.len_._4_1_ = 0;
  local_11c._4_8_ = &PTR__lazy_ostream_00186288;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  if (local_98.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ == 6) {
    local_138[0] = (short)*(int *)((long)local_98.
                                         super_base<char,_trial::url::reader::basic_authority>.
                                         current_view.ptr_ + 4) == 0x3a3a &&
                   *(int *)local_98.super_base<char,_trial::url::reader::basic_authority>.
                           current_view.ptr_ == 0x31313131;
  }
  else {
    local_138[0] = false;
  }
  local_130 = 0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b0 = "";
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_00186598;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_140;
  local_148 = "1111::";
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_00186358;
  local_e8 = &boost::unit_test::lazy_ostream::inst;
  local_140 = &local_98.super_base<char,_trial::url::reader::basic_authority>.current_view;
  local_e0 = (undefined1 *)&local_148;
  boost::test_tools::tt_detail::report_assertion
            (local_138,(undefined1 *)((long)&local_11c.ptr_ + 4),&local_b8,0x1da,2,2,2,
             "reader.literal()",&local_d8,"\"1111::\"",&local_f8);
  boost::detail::shared_count::~shared_count(&sStack_128);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv6_line_9a_v6)
{
    const char input[] = "[1111::]";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv6);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1111::");
}